

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O1

void updateZBuffer(int x,int y,Vec3f *points,Vec2f *text,Vec3f *norms,Vec3f *barycenter,
                  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *framebuffer,
                  vector<float,_std::allocator<float>_> *zBuffer)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  pointer pfVar10;
  pointer pVVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int iVar15;
  int iVar16;
  uchar auVar17 [4];
  TGAColor TVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  fVar19 = barycenter->x;
  fVar23 = barycenter->y;
  fVar1 = barycenter->z;
  fVar21 = points[2].z * fVar1 + points->z * fVar19 + points[1].z * fVar23;
  fVar22 = norms[2].x * fVar1 + norms[1].x * fVar23 + norms->x * fVar19;
  fVar20 = norms[2].y * fVar1 + norms[1].y * fVar23 + norms->y * fVar19;
  fVar23 = fVar1 * norms[2].z + fVar23 * norms[1].z + fVar19 * norms->z;
  fVar19 = fVar23 * fVar23 + fVar22 * fVar22 + fVar20 * fVar20;
  if (fVar19 < 0.0) {
    fVar19 = sqrtf(fVar19);
  }
  else {
    fVar19 = SQRT(fVar19);
  }
  fVar14 = lamp.z;
  fVar13 = lamp.y;
  fVar12 = lamp.x;
  fVar1 = barycenter->x;
  fVar2 = barycenter->y;
  fVar3 = text[1].x;
  fVar4 = text->x;
  fVar5 = barycenter->z;
  fVar6 = text[2].x;
  fVar7 = text[1].y;
  fVar8 = text->y;
  fVar9 = text[2].y;
  iVar15 = TGAImage::get_width(&texture);
  iVar16 = TGAImage::get_height(&texture);
  TVar18 = TGAImage::get(&texture,(int)((float)iVar15 *
                                       (fVar6 * fVar5 + fVar4 * fVar1 + fVar3 * fVar2)),
                         (int)((float)iVar16 * (fVar5 * fVar9 + fVar1 * fVar8 + fVar2 * fVar7)));
  iVar15 = y * 0x800 + x;
  pfVar10 = (zBuffer->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pfVar10[iVar15] <= fVar21) {
    pfVar10[iVar15] = fVar21;
    auVar17 = TVar18.bgra;
    fVar19 = 1.0 / fVar19;
    fVar19 = fVar20 * fVar19 * fVar13 + fVar22 * fVar19 * fVar12 + fVar23 * fVar19 * fVar14;
    pVVar11 = (framebuffer->super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar15 = x + y * -0x800 + 0x2ff800;
    pVVar11[iVar15].x = ((float)((uint)auVar17 >> 0x10 & 0xff) / 255.0) * fVar19;
    pVVar11[iVar15].y = ((float)((uint)auVar17 >> 8 & 0xff) / 255.0) * fVar19;
    pVVar11[iVar15].z = ((float)((uint)auVar17 & 0xff) / 255.0) * fVar19;
  }
  return;
}

Assistant:

void updateZBuffer(int x, int y, Vec3f points[], Vec2f text[], const Vec3f norms[], const Vec3f &barycenter,
                   std::vector<Vec3f> &framebuffer, std::vector<float> &zBuffer) {
    // bi-linear interpolation to retrieve Z
    float z = points[0].z * barycenter.x + points[1].z * barycenter.y + points[2].z * barycenter.z;

    // getting norm of the current point using bi-linear interpolation between norms of vertices
    Vec3f interNorm = (norms[0] * barycenter.x + norms[1] * barycenter.y + norms[2] * barycenter.z).normalize();
    float illuminate = interNorm*lamp;

    // retrieve position in the texture

    float xText, yText;
    xText = text[0].x * barycenter.x + text[1].x * barycenter.y + text[2].x * barycenter.z;
    yText = text[0].y * barycenter.x + text[1].y * barycenter.y + text[2].y * barycenter.z;
    xText *= (float)(texture.get_width());
    yText = (yText) * (float)(texture.get_height());
    TGAColor textureForThePoint = texture.get((int)xText, (int)(yText));

    //    std::cout << (int) textureForThePoint.bgra[2] << std::endl;
    //    std::cout << (int) textureForThePoint.bgra[1] << std::endl;
    //    std::cout << (int) textureForThePoint.bgra[0] << std::endl;
//        std::cout << illuminate << std::endl;

    // checking z-buffer
    if(z >= zBuffer[y*width + x]){
        zBuffer[y*width + x] = z;
        framebuffer[(height - 1 - y)*width + x] = Vec3f(
                ((float)textureForThePoint.bgra[2]/255)*illuminate,
                ((float)textureForThePoint.bgra[1]/255)*illuminate,
                ((float)textureForThePoint.bgra[0]/255)*illuminate
                );
    }
}